

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::enable(backtracer *this,size_t size)

{
  circular_q<spdlog::details::log_msg_buffer> *in_RDI;
  lock_guard<std::mutex> lock;
  memory_order in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  atomic<bool> *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffc8;
  circular_q<spdlog::details::log_msg_buffer> *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,(mutex_type *)in_RDI);
  std::atomic<bool>::store
            (in_stack_ffffffffffffffa8,SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0),
             in_stack_ffffffffffffffa0);
  circular_q<spdlog::details::log_msg_buffer>::circular_q
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  circular_q<spdlog::details::log_msg_buffer>::operator=
            ((circular_q<spdlog::details::log_msg_buffer> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  circular_q<spdlog::details::log_msg_buffer>::~circular_q
            ((circular_q<spdlog::details::log_msg_buffer> *)0x5d1e52);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5d1e5c);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::enable(size_t size) {
    std::lock_guard<std::mutex> lock{mutex_};
    enabled_.store(true, std::memory_order_relaxed);
    messages_ = circular_q<log_msg_buffer>{size};
}